

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTest::DeathTest(DeathTest *this)

{
  UnitTestImpl *pUVar1;
  undefined8 extraout_RAX;
  string local_38;
  allocator local_11;
  
  this->_vptr_DeathTest = (_func_int **)&PTR__DeathTest_0014aad8;
  pUVar1 = GetUnitTestImpl();
  if (pUVar1->current_test_info_ != (TestInfo *)0x0) {
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_38,"Cannot run a death test outside of a TEST or TEST_F construct",
             &local_11);
  DeathTestAbort(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::DeathTest() {
  TestInfo* const info = GetUnitTestImpl()->current_test_info();
  if (info == NULL) {
    DeathTestAbort("Cannot run a death test outside of a TEST or "
                   "TEST_F construct");
  }
}